

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-types.cpp
# Opt level: O3

void __thiscall wasm::Fuzzer::checkLUBs(Fuzzer *this)

{
  ostream *poVar1;
  HeapType HVar2;
  HeapType HVar3;
  char cVar4;
  char cVar5;
  pointer pHVar6;
  HeapType HVar7;
  uintptr_t uVar8;
  pointer pHVar9;
  char extraout_DL;
  char extraout_DL_00;
  char extraout_DL_01;
  ulong uVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [16];
  undefined1 local_1d8 [392];
  HeapType local_50;
  HeapType local_48;
  ulong local_40;
  ulong local_38;
  
  pHVar6 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
           .super__Vector_impl_data._M_start;
  pHVar9 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pHVar9 != pHVar6) {
    local_38 = 0;
    do {
      uVar10 = (long)pHVar9 - (long)pHVar6 >> 3;
      local_40 = local_38;
      if (local_38 < uVar10) {
        do {
          HVar2.id = pHVar6[local_38].id;
          HVar3.id = pHVar6[local_40].id;
          auVar11 = wasm::HeapType::getLeastUpperBound(HVar2,HVar3);
          HVar7.id = auVar11._0_8_;
          local_50.id = HVar3.id;
          local_48.id = HVar2.id;
          auVar12 = wasm::HeapType::getLeastUpperBound(HVar3,HVar2);
          HVar3.id = local_48.id;
          HVar2.id = local_50.id;
          cVar5 = auVar11[8];
          if ((auVar11 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
            if ((auVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              Fatal::Fatal((Fatal *)local_1d8);
              poVar1 = (ostream *)(local_1d8 + 0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar1,"There is no LUB of HeapType ",0x1c);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1," and HeapType ",0xe);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar1,", but there is a LUB in the reverse direction!\n",0x2f);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
              wasm::operator<<(poVar1,local_48);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
              wasm::operator<<(poVar1,local_50);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"lub: ",5);
              wasm::operator<<(poVar1,(HeapType)auVar12._0_8_);
              Fatal::operator<<((Fatal *)local_1d8,(char (*) [2])0x162f76);
LAB_00158c3f:
              Fatal::~Fatal((Fatal *)local_1d8);
            }
            cVar5 = wasm::HeapType::isSubType(local_48,local_50);
            if (cVar5 != '\0') {
              Fatal::Fatal((Fatal *)local_1d8);
              poVar1 = (ostream *)(local_1d8 + 0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar1,"There is no LUB of HeapType ",0x1c);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1," and HeapType ",0xe);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,", but HeapType ",0xf);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar1," is a subtype of HeapType ",0x1a);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"!\n",2);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
              wasm::operator<<(poVar1,HVar3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
              wasm::operator<<(poVar1,HVar2);
              Fatal::operator<<((Fatal *)local_1d8,(char (*) [2])0x162f76);
              goto LAB_00158c3f;
            }
            cVar5 = wasm::HeapType::isSubType(HVar2,HVar3);
            if (cVar5 != '\0') {
              Fatal::Fatal((Fatal *)local_1d8);
              poVar1 = (ostream *)(local_1d8 + 0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar1,"There is no LUB of HeapType ",0x1c);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1," and HeapType ",0xe);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,", but HeapType ",0xf);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar1," is a subtype of HeapType ",0x1a);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"!\n",2);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
              wasm::operator<<(poVar1,HVar3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
              wasm::operator<<(poVar1,HVar2);
              Fatal::operator<<((Fatal *)local_1d8,(char (*) [2])0x162f76);
              goto LAB_00158c3f;
            }
          }
          else {
            if ((((cVar5 != auVar12[8]) || (HVar7.id != auVar12._0_8_)) ||
                (uVar8 = wasm::HeapType::getLeastUpperBound(local_48,local_50),
                HVar2.id = local_48.id, cVar5 != extraout_DL)) || (HVar7.id != uVar8)) {
              Fatal::Fatal((Fatal *)local_1d8);
              poVar1 = (ostream *)(local_1d8 + 0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar1,"Could not calculate a stable LUB of HeapTypes ",0x2e);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1," and ",5);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"!\n",2);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
              wasm::operator<<(poVar1,local_48);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
              wasm::operator<<(poVar1,local_50);
              Fatal::operator<<((Fatal *)local_1d8,(char (*) [2])0x162f76);
              goto LAB_00158c3f;
            }
            cVar4 = wasm::HeapType::isSubType(local_48,HVar7);
            HVar3.id = local_50.id;
            if (cVar4 == '\0') {
              Fatal::Fatal((Fatal *)local_1d8);
              poVar1 = (ostream *)(local_1d8 + 0x10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"HeapType ",9);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar1," is not a subtype of its LUB with HeapType ",0x2b);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"!\n",2);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
              wasm::operator<<(poVar1,HVar2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
              wasm::operator<<(poVar1,local_50);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"lub: ",5);
              wasm::operator<<(poVar1,HVar7);
              Fatal::operator<<((Fatal *)local_1d8,(char (*) [2])0x162f76);
              goto LAB_00158c3f;
            }
            cVar4 = wasm::HeapType::isSubType(local_50,HVar7);
            if (cVar4 == '\0') {
              Fatal::Fatal((Fatal *)local_1d8);
              poVar1 = (ostream *)(local_1d8 + 0x10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"HeapType ",9);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar1," is not a subtype of its LUB with HeapType ",0x2b);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"!\n",2);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
              wasm::operator<<(poVar1,local_48);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
              wasm::operator<<(poVar1,HVar3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"lub: ",5);
              wasm::operator<<(poVar1,HVar7);
              Fatal::operator<<((Fatal *)local_1d8,(char (*) [2])0x162f76);
              goto LAB_00158c3f;
            }
            uVar8 = wasm::HeapType::getLeastUpperBound(local_48,HVar7);
            if ((cVar5 != extraout_DL_00) || (HVar7.id != uVar8)) {
              Fatal::Fatal((Fatal *)local_1d8);
              poVar1 = (ostream *)(local_1d8 + 0x10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"The LUB of HeapType ",0x14)
              ;
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1," and HeapType ",0xe);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar1," should be the LUB of itself and HeapType ",0x2a);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,", but it is not!\n",0x11);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
              wasm::operator<<(poVar1,local_48);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
              wasm::operator<<(poVar1,local_50);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"lub: ",5);
              wasm::operator<<(poVar1,HVar7);
              Fatal::operator<<((Fatal *)local_1d8,(char (*) [2])0x162f76);
              goto LAB_00158c3f;
            }
            uVar8 = wasm::HeapType::getLeastUpperBound(HVar7,HVar3);
            if ((cVar5 != extraout_DL_01) || (HVar7.id != uVar8)) {
              Fatal::Fatal((Fatal *)local_1d8);
              poVar1 = (ostream *)(local_1d8 + 0x10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"The LUB of HeapType ",0x14)
              ;
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1," and HeapType ",0xe);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar1," should be the LUB of itself and HeapType ",0x2a);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,", but it is not!\n",0x11);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
              wasm::operator<<(poVar1,local_48);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
              wasm::operator<<(poVar1,local_50);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"lub: ",5);
              wasm::operator<<(poVar1,HVar7);
              Fatal::operator<<((Fatal *)local_1d8,(char (*) [2])0x162f76);
              goto LAB_00158c3f;
            }
          }
          local_40 = local_40 + 1;
          pHVar6 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pHVar9 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          uVar10 = (long)pHVar9 - (long)pHVar6 >> 3;
        } while (local_40 < uVar10);
      }
      local_38 = local_38 + 1;
    } while (local_38 < uVar10);
  }
  return;
}

Assistant:

void Fuzzer::checkLUBs() const {
  // For each unordered pair of types...
  for (size_t i = 0; i < types.size(); ++i) {
    for (size_t j = i; j < types.size(); ++j) {
      HeapType a = types[i], b = types[j];
      // Check that their LUB is stable when calculated multiple times and in
      // reverse order.
      auto lub = HeapType::getLeastUpperBound(a, b);
      if (lub) {
        if (lub != HeapType::getLeastUpperBound(b, a) ||
            lub != HeapType::getLeastUpperBound(a, b)) {
          Fatal() << "Could not calculate a stable LUB of HeapTypes " << i
                  << " and " << j << "!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n";
        }
        // Check that each type is a subtype of the LUB.
        if (!HeapType::isSubType(a, *lub)) {
          Fatal() << "HeapType " << i
                  << " is not a subtype of its LUB with HeapType " << j << "!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n"
                  << "lub: " << *lub << "\n";
        }
        if (!HeapType::isSubType(b, *lub)) {
          Fatal() << "HeapType " << j
                  << " is not a subtype of its LUB with HeapType " << i << "!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n"
                  << "lub: " << *lub << "\n";
        }
        // Check that the LUB of each type and the original LUB is still the
        // original LUB.
        if (lub != HeapType::getLeastUpperBound(a, *lub)) {
          Fatal() << "The LUB of HeapType " << i << " and HeapType " << j
                  << " should be the LUB of itself and HeapType " << i
                  << ", but it is not!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n"
                  << "lub: " << *lub << "\n";
        }
        if (lub != HeapType::getLeastUpperBound(*lub, b)) {
          Fatal() << "The LUB of HeapType " << i << " and HeapType " << j
                  << " should be the LUB of itself and HeapType " << j
                  << ", but it is not!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n"
                  << "lub: " << *lub << "\n";
        }
      } else {
        // No LUB. Check that this is symmetrical.
        if (auto lub2 = HeapType::getLeastUpperBound(b, a)) {
          Fatal() << "There is no LUB of HeapType " << i << " and HeapType "
                  << j << ", but there is a LUB in the reverse direction!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n"
                  << "lub: " << *lub2 << "\n";
        }
        // There also shouldn't be a subtype relation in this case.
        if (HeapType::isSubType(a, b)) {
          Fatal() << "There is no LUB of HeapType " << i << " and HeapType "
                  << j << ", but HeapType " << i << " is a subtype of HeapType "
                  << j << "!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n";
        }
        if (HeapType::isSubType(b, a)) {
          Fatal() << "There is no LUB of HeapType " << i << " and HeapType "
                  << j << ", but HeapType " << j << " is a subtype of HeapType "
                  << i << "!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n";
        }
      }
    }
  }
}